

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall roaring::Roaring64Map::Roaring64Map(Roaring64Map *this,size_t n,uint64_t *data)

{
  undefined8 *in_RDI;
  uint64_t *in_stack_00000010;
  size_t in_stack_00000018;
  
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::map((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         *)0x115240);
  *(undefined1 *)(in_RDI + 6) = 0;
  addMany((Roaring64Map *)data,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

Roaring64Map(size_t n, const uint64_t *data) { addMany(n, data); }